

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<int,duckdb::date_t,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool>
               (int *ldata,date_t *rdata,date_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  int right;
  bool bVar1;
  date_t dVar2;
  idx_t iVar3;
  SelectionVector *in_RCX;
  long in_RDX;
  ValidityMask *in_RSI;
  idx_t in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  date_t rentry_1;
  int lentry_1;
  idx_t i_1;
  date_t rentry;
  int lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  idx_t in_stack_ffffffffffffff78;
  idx_t idx;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff80;
  ValidityMask *mask;
  int in_stack_ffffffffffffff88;
  date_t in_stack_ffffffffffffff8c;
  undefined1 fun_00;
  date_t in_stack_ffffffffffffff90;
  ulong local_68;
  ulong local_40;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar1))
  {
    for (local_68 = 0; fun_00 = (undefined1)((uint)in_stack_ffffffffffffff8c.days >> 0x18),
        local_68 < in_R9; local_68 = local_68 + 1) {
      idx = in_RDI;
      SelectionVector::get_index(in_RCX,local_68);
      mask = in_RSI;
      iVar3 = SelectionVector::get_index(in_R8,local_68);
      right = *(int *)((long)&(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                      iVar3 * 4);
      in_stack_ffffffffffffff8c =
           BinaryStandardOperatorWrapper::
           Operation<bool,duckdb::AddOperator,int,duckdb::date_t,duckdb::date_t>
                     ((bool)fun_00,right,(date_t)right,mask,idx);
      *(int32_t *)(in_RDX + local_68 * 4) = in_stack_ffffffffffffff8c.days;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_R9; local_40 = local_40 + 1) {
      SelectionVector::get_index(in_RCX,local_40);
      SelectionVector::get_index(in_R8,local_40);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        ((TemplatedValidityMask<unsigned_long> *)
                         CONCAT44(in_stack_ffffffffffffff8c.days,in_stack_ffffffffffffff88),
                         (idx_t)in_stack_ffffffffffffff80);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            ((TemplatedValidityMask<unsigned_long> *)
                             CONCAT44(in_stack_ffffffffffffff8c.days,in_stack_ffffffffffffff88),
                             (idx_t)in_stack_ffffffffffffff80), bVar1)) {
        dVar2 = BinaryStandardOperatorWrapper::
                Operation<bool,duckdb::AddOperator,int,duckdb::date_t,duckdb::date_t>
                          (SUB41((uint)in_stack_ffffffffffffff8c.days >> 0x18,0),
                           in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,
                           (ValidityMask *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        *(int32_t *)(in_RDX + local_40 * 4) = dVar2.days;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}